

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

int __thiscall MIDIStreamer::ServiceEvent(MIDIStreamer *this)

{
  uint uVar1;
  uint local_1c;
  int res;
  MIDIStreamer *this_local;
  
  if (this->EndQueued == 2) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         (*this->MIDI->_vptr_MIDIDevice[0xd])(this->MIDI,this->Buffer + this->BufferNum);
    if (this_local._4_4_ == 0) {
      while( true ) {
        if (this->EndQueued == 1) {
          local_1c = FillStopBuffer(this,this->BufferNum);
          if ((local_1c & 3) != 2) {
            this->EndQueued = 2;
          }
        }
        else {
          local_1c = FillBuffer(this,this->BufferNum,0x80,100000);
        }
        if ((local_1c & 3) == 0) {
          uVar1 = (*this->MIDI->_vptr_MIDIDevice[0x10])();
          if ((((uVar1 & 1) != 0) &&
              (local_1c = (*this->MIDI->_vptr_MIDIDevice[9])
                                    (this->MIDI,this->Buffer + this->BufferNum), local_1c != 0)) ||
             ((uVar1 = (*this->MIDI->_vptr_MIDIDevice[0x10])(), (uVar1 & 1) == 0 &&
              (local_1c = (*this->MIDI->_vptr_MIDIDevice[8])
                                    (this->MIDI,this->Buffer + this->BufferNum), local_1c != 0)))) {
            return local_1c;
          }
          this->BufferNum = this->BufferNum ^ 1;
          goto LAB_0041a56b;
        }
        if ((local_1c & 3) != 1) {
          return (int)local_1c >> 2;
        }
        if (((this->super_MusInfo).m_Looping & 1U) == 0) break;
        this->Restarting = true;
      }
      this->EndQueued = 1;
LAB_0041a56b:
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MIDIStreamer::ServiceEvent()
{
	int res;

	if (EndQueued == 2)
	{
		return 0;
	}
	if (0 != (res = MIDI->UnprepareHeader(&Buffer[BufferNum])))
	{
		return res;
	}
fill:
	if (EndQueued == 1)
	{
		res = FillStopBuffer(BufferNum);
		if ((res & 3) != SONG_ERROR)
		{
			EndQueued = 2;
		}
	}
	else
	{
		res = FillBuffer(BufferNum, MAX_EVENTS, MAX_TIME);
	}
	switch (res & 3)
	{
	case SONG_MORE:
		if ((MIDI->NeedThreadedCallback() && 0 != (res = MIDI->StreamOutSync(&Buffer[BufferNum]))) ||
			(!MIDI->NeedThreadedCallback() && 0 != (res = MIDI->StreamOut(&Buffer[BufferNum]))))
		{
			return res;
		}
		else
		{
			BufferNum ^= 1;
		}
		break;

	case SONG_DONE:
		if (m_Looping)
		{
			Restarting = true;
			goto fill;
		}
		EndQueued = 1;
		break;

	default:
		return res >> 2;
	}
	return 0;
}